

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O3

int __thiscall
gmath::OrthoCamera::clone
          (OrthoCamera *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  double dVar3;
  undefined8 *puVar4;
  long lVar5;
  
  puVar4 = (undefined8 *)operator_new(0xd0);
  puVar4[1] = puVar4 + 3;
  puVar4[2] = 0;
  *(undefined1 *)(puVar4 + 3) = 0;
  puVar4[10] = 0;
  puVar4[0xb] = 0;
  puVar4[8] = 0;
  puVar4[9] = 0;
  puVar4[0xc] = 0;
  puVar4[0xd] = 0;
  puVar4[0xe] = 0;
  puVar4[7] = 0x3ff0000000000000;
  puVar4[0xb] = 0x3ff0000000000000;
  puVar4[0xf] = 0x3ff0000000000000;
  puVar4[0x15] = 0;
  puVar4[0x16] = 0;
  puVar4[0x17] = 0;
  puVar4[5] = 0;
  puVar4[6] = 0;
  puVar4[0x10] = 0;
  puVar4[0x11] = 0;
  puVar4[0x12] = 0;
  puVar4[0x13] = 0;
  puVar4[0x14] = 0x7fefffffffffffff;
  *puVar4 = &PTR__Camera_00124c58;
  puVar4[0x18] = 0x3ff0000000000000;
  puVar4[0x19] = 0x3ff0000000000000;
  std::__cxx11::string::_M_assign((string *)(puVar4 + 1));
  lVar5 = (this->super_Camera).height;
  puVar4[5] = (this->super_Camera).width;
  puVar4[6] = lVar5;
  lVar5 = 0x38;
  do {
    *(undefined8 *)((long)puVar4 + lVar5 + 0x10) =
         *(undefined8 *)((long)((this->super_Camera).R.v + -2) + 8 + lVar5);
    puVar1 = (undefined8 *)((long)((this->super_Camera).R.v + -3) + 0x10 + lVar5);
    uVar2 = puVar1[1];
    *(undefined8 *)((long)puVar4 + lVar5) = *puVar1;
    ((undefined8 *)((long)puVar4 + lVar5))[1] = uVar2;
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x80);
  puVar4[0x12] = (this->super_Camera).T.v[2];
  dVar3 = (this->super_Camera).T.v[1];
  puVar4[0x10] = (this->super_Camera).T.v[0];
  puVar4[0x11] = dVar3;
  dVar3 = (this->super_Camera).zmax;
  puVar4[0x13] = (this->super_Camera).zmin;
  puVar4[0x14] = dVar3;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(puVar4 + 0x15),&(this->super_Camera).match);
  dVar3 = this->dres;
  puVar4[0x18] = this->res;
  puVar4[0x19] = dVar3;
  return (int)puVar4;
}

Assistant:

Camera *OrthoCamera::clone() const
{
  OrthoCamera *ret=new OrthoCamera();

  *ret=*this;

  return ret;
}